

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
close_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,frame *wsp)

{
  descriptor<pstore::details::posix_descriptor_traits> dVar1;
  bool bVar2;
  ushort uVar3;
  ushort code;
  close_status_code status;
  ulong uVar4;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  
  status = (close_status_code)wsp;
  dVar1 = io._M_data[1];
  uVar4 = (long)io._M_data[2] - (long)dVar1;
  if (io._M_data[2] == dVar1) {
    uVar3 = 1000;
  }
  else if (uVar4 == 1) {
    uVar3 = 0x3ea;
  }
  else {
    code = *(ushort *)dVar1 << 8 | *(ushort *)dVar1 >> 8;
    bVar2 = is_valid_close_status_code(code);
    uVar3 = 0x3ea;
    if ((bVar2) && (uVar3 = code, 2 < uVar4)) {
      bVar2 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((uchar *)((long)io._M_data[1] + 2),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )*(uchar **)(io._M_data + 2));
      uVar3 = 0x3ef;
      if (bVar2) {
        uVar3 = code;
      }
    }
  }
  io_00._M_data._2_6_ = 0;
  io_00._M_data._0_2_ = uVar3;
  send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,this,sender,io_00,status);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> close_message (Sender const sender, IO const io, frame const & wsp) {
            auto state = close_status_code::normal;
            auto const payload_size = wsp.payload.size ();

            // "If there is a body, the first two bytes of the body MUST be a 2-byte unsigned
            // integer (in network byte order) representing a status code with value /code/ defined
            // in Section 7.4. Following the 2-byte integer, the body MAY contain UTF-8-encoded data
            // with value /reason/, the interpretation of which is not defined by this
            // specification."
            if (payload_size == 0U) {
                // That's fine. Just a normal close.
                state = close_status_code::normal;
            } else if (payload_size < sizeof (std::uint16_t)) {
                // Bad message. Payload must be 0 or at least a 2 byte close-code.
                state = close_status_code::protocol_error;
            } else {
                // Extract the close state from the message payload.
                PSTORE_ASSERT (payload_size >= sizeof (std::uint16_t));
                state = static_cast<close_status_code> (network_to_host (
                    *reinterpret_cast<std::uint16_t const *> (wsp.payload.data ())));

                if (!is_valid_close_status_code (static_cast<std::uint16_t> (state))) {
                    state = close_status_code::protocol_error;
                } else if (payload_size > sizeof (std::uint16_t)) {
                    auto first = std::begin (wsp.payload);
                    std::advance (first, sizeof (std::uint16_t));
                    if (!is_valid_utf8 (first, std::end (wsp.payload))) {
                        state = close_status_code::invalid_payload;
                    }
                }
            }

            return send_close_frame (sender, io, state);
        }